

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# library_bind.c
# Opt level: O1

int mpt_library_bind(mpt_libsymbol *sym,char *conf,char *path,mpt_logger *out)

{
  char *pcVar1;
  long lVar2;
  mpt_logger *fmt;
  int iVar3;
  int iVar4;
  char *pcVar5;
  bool bVar6;
  mpt_libsymbol next;
  mpt_libsymbol local_48;
  
  local_48.lib = (mpt_libhandle *)0x0;
  local_48.addr = (void *)0x0;
  local_48.type = 0;
  if (conf == (char *)0x0) {
    iVar3 = -1;
    if (out != (mpt_logger *)0x0) {
      msg(out,(char *)0x0,3,(char *)out,"missing initializer target");
    }
  }
  else {
    fmt = out;
    pcVar1 = strchr(conf,0x40);
    if (pcVar1 == (char *)0x0) {
      iVar3 = 0;
    }
    else {
      pcVar5 = path;
      local_48.lib = mpt_library_open(pcVar1 + 1,path);
      iVar3 = 1;
      if (local_48.lib == (mpt_libhandle *)0x0) {
        iVar4 = 1;
        if ((out != (mpt_logger *)0x0) && (lVar2 = dlerror(), lVar2 != 0)) {
          iVar4 = (path == (char *)0x0) + 3;
          msg(out,pcVar5,iVar4,(char *)fmt,lVar2);
        }
        if (path == (char *)0x0) {
          bVar6 = false;
          iVar3 = iVar4;
        }
        else {
          pcVar5 = (char *)0x0;
          local_48.lib = mpt_library_open(pcVar1 + 1,(char *)0x0);
          bVar6 = local_48.lib != (mpt_libhandle *)0x0;
          iVar3 = 2;
          if (!bVar6) {
            iVar3 = iVar4;
          }
          if (out != (mpt_logger *)0x0 && !bVar6) {
            lVar2 = dlerror();
            bVar6 = false;
            iVar3 = iVar4;
            if (lVar2 != 0) {
              msg(out,pcVar5,3,(char *)fmt,lVar2);
            }
          }
        }
        if (!bVar6) {
          return -2;
        }
      }
    }
    iVar4 = mpt_library_symbol(&local_48,conf);
    if (iVar4 < 0) {
      if ((out != (mpt_logger *)0x0) && (lVar2 = dlerror(), lVar2 != 0)) {
        msg(out,conf,3,(char *)fmt,lVar2);
      }
      iVar4 = mpt_library_detach(&local_48.lib);
      iVar3 = -2;
      if (iVar4 < 0) {
        if (out == (mpt_logger *)0x0) {
          abort();
        }
        lVar2 = dlerror();
        iVar3 = iVar4;
        if (lVar2 != 0) {
          msg(out,conf,1,(char *)fmt,lVar2);
        }
      }
    }
    else {
      mpt_library_detach(&sym->lib);
      sym->lib = local_48.lib;
      sym->addr = local_48.addr;
      sym->type = local_48.type;
    }
  }
  return iVar3;
}

Assistant:

extern int mpt_library_bind(MPT_STRUCT(libsymbol) *sym, const char *conf, const char *path, MPT_INTERFACE(logger) *out)
{
	MPT_STRUCT(libsymbol) next = MPT_LIBSYMBOL_INIT;
	const char *libname;
	int ret = 0;
	
	if (!conf) {
		if (out) {
			msg(out, __func__, MPT_LOG(Error), "%s", MPT_tr("missing initializer target"));
		}
		return MPT_ERROR(BadArgument);
	}
	if ((libname = strchr(conf, '@'))) {
		ret = 1;
		++libname;
		/* load from special or default location */
		if (!(next.lib = mpt_library_open(libname, path))) {
			const char *err;
			if (out && (err = dlerror())) {
				ret = path ? MPT_LOG(Error) : MPT_LOG(Warning);
				msg(out, __func__, ret, "%s", err);
			}
			if (!path) {
				return MPT_ERROR(BadValue);
			}
			/* fallback to default library locations */
			if (!(next.lib = mpt_library_open(libname, 0))) {
				if (out && (err = dlerror())) {
					msg(out, __func__, MPT_LOG(Error), "%s", err);
				}
				return MPT_ERROR(BadValue);
			}
			ret = 2;
		}
	}
	if (mpt_library_symbol(&next, conf) < 0) {
		const char *err;
		if (out && (err = dlerror())) {
			msg(out, __func__, MPT_LOG(Error), "%s", err);
		}
		if ((ret = mpt_library_detach(&next.lib)) < 0) {
			if (!out) {
				abort();
			}
			if ((err = dlerror())) {
				msg(out, __func__, MPT_LOG(Fatal), "%s", err);
			}
			return ret;
		}
		return MPT_ERROR(BadValue);
	}
	mpt_library_detach(&sym->lib);
	
	*sym = next;
	
	return ret;
}